

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::ArgMaxParameter::InternalSwap(ArgMaxParameter *this,ArgMaxParameter *other)

{
  InternalMetadataWithArena *this_00;
  bool bVar1;
  int32 iVar2;
  uint32 uVar3;
  int iVar4;
  void *pvVar5;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar6;
  UnknownFieldSet *pUVar7;
  UnknownFieldSet *pUVar8;
  
  bVar1 = this->out_max_val_;
  this->out_max_val_ = other->out_max_val_;
  other->out_max_val_ = bVar1;
  iVar2 = this->axis_;
  this->axis_ = other->axis_;
  other->axis_ = iVar2;
  uVar3 = this->top_k_;
  this->top_k_ = other->top_k_;
  other->top_k_ = uVar3;
  uVar3 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar3;
  this_00 = &other->_internal_metadata_;
  if ((((ulong)(this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) != 0) ||
     (((ulong)(this_00->
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ).ptr_ & 1) != 0)) {
    pvVar5 = (this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar5 & 1) == 0) {
      pUVar8 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar8 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
    }
    pvVar5 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
    if (((ulong)pvVar5 & 1) == 0) {
      pUVar7 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar7 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
    }
    pvVar6 = pUVar7->fields_;
    pUVar7->fields_ = pUVar8->fields_;
    pUVar8->fields_ = pvVar6;
  }
  iVar4 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar4;
  return;
}

Assistant:

void ArgMaxParameter::InternalSwap(ArgMaxParameter* other) {
  std::swap(out_max_val_, other->out_max_val_);
  std::swap(axis_, other->axis_);
  std::swap(top_k_, other->top_k_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}